

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::MultiNodeChain<QtGraphicsAnchorLayout::GraphPath>::free
          (MultiNodeChain<QtGraphicsAnchorLayout::GraphPath> *this,void *__ptr)

{
  MultiNodeChain<QtGraphicsAnchorLayout::GraphPath> *pMVar1;
  MultiNodeChain<QtGraphicsAnchorLayout::GraphPath> *n;
  MultiNodeChain<QtGraphicsAnchorLayout::GraphPath> *e;
  qsizetype nEntries;
  MultiNodeChain<QtGraphicsAnchorLayout::GraphPath> *local_18;
  
  pMVar1 = this;
  while (local_18 = pMVar1, local_18 != (MultiNodeChain<QtGraphicsAnchorLayout::GraphPath> *)0x0) {
    pMVar1 = local_18->next;
    if (local_18 != (MultiNodeChain<QtGraphicsAnchorLayout::GraphPath> *)0x0) {
      ~MultiNodeChain((MultiNodeChain<QtGraphicsAnchorLayout::GraphPath> *)0x9638fc);
      operator_delete(local_18,0x18);
    }
  }
  return;
}

Assistant:

qsizetype free() noexcept(std::is_nothrow_destructible_v<T>)
    {
        qsizetype nEntries = 0;
        MultiNodeChain *e = this;
        while (e) {
            MultiNodeChain *n = e->next;
            ++nEntries;
            delete e;
            e = n;
        }
        return  nEntries;
    }